

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O3

base_learner * OjaNewton_setup(options_i *options,vw *all)

{
  _func_int **pp_Var1;
  undefined8 uVar2;
  double dVar3;
  int *piVar4;
  options_i *poVar5;
  int iVar6;
  OjaNewton *__s;
  option_group_definition *poVar7;
  typed_option<int> *ptVar8;
  typed_option<float> *ptVar9;
  float *pfVar10;
  float **ppfVar11;
  ulong uVar12;
  example **ppeVar13;
  learner<OjaNewton,_example> *plVar14;
  uint32_t *puVar15;
  long lVar16;
  bool oja_newton;
  float alpha_inverse;
  string random_init;
  string normalize;
  option_group_definition new_options;
  bool local_801;
  vw *local_800;
  float local_7f4;
  free_ptr<OjaNewton> local_7f0;
  float *local_7e0;
  int *local_7d8;
  options_i *local_7d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a8;
  undefined1 *local_788 [2];
  undefined1 local_778 [16];
  string local_768;
  undefined1 *local_748 [2];
  undefined1 local_738 [16];
  string local_728;
  undefined1 *local_708 [2];
  undefined1 local_6f8 [16];
  string local_6e8;
  undefined1 *local_6c8 [2];
  undefined1 local_6b8 [16];
  string local_6a8;
  undefined1 *local_688 [2];
  undefined1 local_678 [16];
  string local_668;
  undefined1 *local_648 [2];
  undefined1 local_638 [16];
  string local_628;
  undefined1 *local_608;
  long local_600;
  undefined1 local_5f8 [16];
  option_group_definition local_5e8;
  undefined1 *local_5b0 [2];
  undefined1 local_5a0 [16];
  string local_590;
  string local_570;
  undefined1 *local_550 [2];
  undefined1 local_540 [16];
  undefined1 local_530 [112];
  bool local_4c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_498;
  undefined1 local_490 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_408;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3f8;
  undefined1 local_3f0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_368;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_358;
  undefined1 local_350 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2b8;
  typed_option<float> local_2b0;
  typed_option<float> local_210;
  typed_option<int> local_170;
  typed_option<int> local_d0;
  
  local_800 = all;
  __s = calloc_or_throw<OjaNewton>(1);
  memset(__s,0,0xb0);
  local_7f0._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(void_*),_false>)destroy_free<OjaNewton>;
  local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
  local_7f0._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>.
  _M_head_impl = __s;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"true","");
  local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c8,"true","");
  local_608 = local_5f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_608,"OjaNewton options","");
  local_5e8.m_name._M_dataplus._M_p = (pointer)&local_5e8.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_5e8,local_608,local_608 + local_600);
  local_5e8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5e8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5e8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_608 != local_5f8) {
    operator_delete(local_608);
  }
  local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"OjaNewton","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_530,&local_628,&local_801);
  local_4c0 = true;
  local_648[0] = local_638;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_648,"Online Newton with Oja\'s Sketch","");
  std::__cxx11::string::_M_assign((string *)(local_530 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (&local_5e8,(typed_option<bool> *)local_530);
  local_668._M_dataplus._M_p = (pointer)&local_668.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_668,"sketch_size","");
  VW::config::typed_option<int>::typed_option(&local_d0,&local_668,&__s->m);
  ptVar8 = VW::config::typed_option<int>::default_value(&local_d0,10);
  local_688[0] = local_678;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_688,"size of sketch","");
  std::__cxx11::string::_M_assign((string *)&(ptVar8->super_base_option).m_help);
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<int>&>(poVar7,ptVar8);
  local_6a8._M_dataplus._M_p = (pointer)&local_6a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a8,"epoch_size","");
  VW::config::typed_option<int>::typed_option(&local_170,&local_6a8,&__s->epoch_size);
  ptVar8 = VW::config::typed_option<int>::default_value(&local_170,1);
  local_6c8[0] = local_6b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6c8,"size of epoch","");
  std::__cxx11::string::_M_assign((string *)&(ptVar8->super_base_option).m_help);
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<int>&>(poVar7,ptVar8);
  local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e8,"alpha","");
  local_7e0 = &__s->alpha;
  VW::config::typed_option<float>::typed_option(&local_210,&local_6e8,local_7e0);
  ptVar9 = VW::config::typed_option<float>::default_value(&local_210,1.0);
  local_708[0] = local_6f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_708,"mutiplicative constant for indentiy","");
  std::__cxx11::string::_M_assign((string *)&(ptVar9->super_base_option).m_help);
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar7,ptVar9)
  ;
  local_728._M_dataplus._M_p = (pointer)&local_728.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_728,"alpha_inverse","");
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_350,&local_728,&local_7f4);
  local_748[0] = local_738;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_748,"one over alpha, similar to learning rate","");
  std::__cxx11::string::_M_assign((string *)(local_350 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                     (poVar7,(typed_option<float> *)local_350);
  local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"learning_rate_cnt","");
  VW::config::typed_option<float>::typed_option(&local_2b0,&local_768,&__s->learning_rate_cnt);
  local_7d0 = options;
  ptVar9 = VW::config::typed_option<float>::default_value(&local_2b0,2.0);
  local_550[0] = local_540;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_550,"constant for the learning rate 1/t","");
  std::__cxx11::string::_M_assign((string *)&(ptVar9->super_base_option).m_help);
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar7,ptVar9)
  ;
  local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_570,"normalize","");
  local_7d8 = &__s->epoch_size;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_3f0,&local_570,&local_7a8);
  local_788[0] = local_778;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_788,"normalize the features or not","");
  std::__cxx11::string::_M_assign((string *)(local_3f0 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
                     (poVar7,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_3f0);
  local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_590,"random_init","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_490,&local_590,&local_7c8);
  local_5b0[0] = local_5a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5b0,"randomize initialization of Oja or not","");
  std::__cxx11::string::_M_assign((string *)(local_490 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (poVar7,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_490);
  if (local_5b0[0] != local_5a0) {
    operator_delete(local_5b0[0]);
  }
  local_490._0_8_ = &PTR__typed_option_002d9148;
  if (local_3f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f8._M_pi);
  }
  if (local_408._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_408._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_490);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    operator_delete(local_590._M_dataplus._M_p);
  }
  if (local_788[0] != local_778) {
    operator_delete(local_788[0]);
  }
  local_3f0._0_8_ = &PTR__typed_option_002d9148;
  if (local_358._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_358._M_pi);
  }
  if (local_368._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_368._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_3f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    operator_delete(local_570._M_dataplus._M_p);
  }
  if (local_550[0] != local_540) {
    operator_delete(local_550[0]);
  }
  poVar5 = local_7d0;
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d90d8;
  if (local_2b0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2b0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768._M_dataplus._M_p != &local_768.field_2) {
    operator_delete(local_768._M_dataplus._M_p);
  }
  if (local_748[0] != local_738) {
    operator_delete(local_748[0]);
  }
  local_350._0_8_ = &PTR__typed_option_002d90d8;
  if (local_2b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2b8._M_pi);
  }
  if (local_2c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2c8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_350);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_728._M_dataplus._M_p != &local_728.field_2) {
    operator_delete(local_728._M_dataplus._M_p);
  }
  if (local_708[0] != local_6f8) {
    operator_delete(local_708[0]);
  }
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d90d8;
  if (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e8._M_dataplus._M_p != &local_6e8.field_2) {
    operator_delete(local_6e8._M_dataplus._M_p);
  }
  if (local_6c8[0] != local_6b8) {
    operator_delete(local_6c8[0]);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d96b0;
  if (local_170.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a8._M_dataplus._M_p != &local_6a8.field_2) {
    operator_delete(local_6a8._M_dataplus._M_p);
  }
  if (local_688[0] != local_678) {
    operator_delete(local_688[0]);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d96b0;
  if (local_d0.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_668._M_dataplus._M_p != &local_668.field_2) {
    operator_delete(local_668._M_dataplus._M_p);
  }
  if (local_648[0] != local_638) {
    operator_delete(local_648[0]);
  }
  local_530._0_8_ = &PTR__typed_option_002d9110;
  if (local_498._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_498._M_pi);
  }
  if (local_4a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4a8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_530);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_628._M_dataplus._M_p != &local_628.field_2) {
    operator_delete(local_628._M_dataplus._M_p);
  }
  (**poVar5->_vptr_options_i)(poVar5,&local_5e8);
  pp_Var1 = (_func_int **)(local_530 + 0x10);
  local_530._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_530,"OjaNewton","");
  iVar6 = (*poVar5->_vptr_options_i[1])(poVar5,local_530);
  if ((_func_int **)local_530._0_8_ != pp_Var1) {
    operator_delete((void *)local_530._0_8_);
  }
  if ((char)iVar6 == '\0') {
    plVar14 = (learner<OjaNewton,_example> *)0x0;
  }
  else {
    __s->all = local_800;
    iVar6 = std::__cxx11::string::compare((char *)&local_7a8);
    __s->normalize = iVar6 == 0;
    iVar6 = std::__cxx11::string::compare((char *)&local_7c8);
    __s->random_init = iVar6 == 0;
    local_530._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_530,"alpha_inverse","");
    iVar6 = (*poVar5->_vptr_options_i[1])(poVar5,local_530);
    if ((_func_int **)local_530._0_8_ != pp_Var1) {
      operator_delete((void *)local_530._0_8_);
    }
    if ((char)iVar6 != '\0') {
      *local_7e0 = 1.0 / local_7f4;
    }
    __s->cnt = 0;
    __s->t = 1;
    pfVar10 = calloc_or_throw<float>((long)__s->m + 1);
    __s->ev = pfVar10;
    pfVar10 = calloc_or_throw<float>((long)__s->m + 1);
    __s->b = pfVar10;
    pfVar10 = calloc_or_throw<float>((long)__s->m + 1);
    __s->D = pfVar10;
    ppfVar11 = calloc_or_throw<float*>((long)__s->m + 1);
    __s->A = ppfVar11;
    ppfVar11 = calloc_or_throw<float*>((long)__s->m + 1);
    piVar4 = local_7d8;
    __s->K = ppfVar11;
    uVar12 = (ulong)(uint)__s->m;
    if (0 < __s->m) {
      lVar16 = 0;
      do {
        pfVar10 = calloc_or_throw<float>((long)((int)uVar12 + 1));
        __s->A[lVar16 + 1] = pfVar10;
        pfVar10 = calloc_or_throw<float>((long)__s->m + 1);
        __s->K[lVar16 + 1] = pfVar10;
        __s->A[lVar16 + 1][lVar16 + 1] = 1.0;
        __s->K[lVar16 + 1][lVar16 + 1] = 1.0;
        __s->D[lVar16 + 1] = 1.0;
        uVar12 = (ulong)__s->m;
        lVar16 = lVar16 + 1;
      } while (lVar16 < (long)uVar12);
    }
    ppeVar13 = calloc_or_throw<example*>((long)*piVar4);
    __s->buffer = ppeVar13;
    pfVar10 = calloc_or_throw<float>((long)__s->epoch_size);
    __s->weight_buffer = pfVar10;
    pfVar10 = calloc_or_throw<float>((long)__s->m + 1);
    __s->zv = pfVar10;
    pfVar10 = calloc_or_throw<float>((long)__s->m + 1);
    __s->vv = pfVar10;
    pfVar10 = calloc_or_throw<float>((long)__s->m + 1);
    __s->tmp = pfVar10;
    (__s->data).ON = __s;
    pfVar10 = calloc_or_throw<float>((long)__s->m + 1);
    (__s->data).Zx = pfVar10;
    pfVar10 = calloc_or_throw<float>((long)__s->m + 1);
    (__s->data).AZx = pfVar10;
    pfVar10 = calloc_or_throw<float>((long)__s->m + 1);
    (__s->data).delta = pfVar10;
    dVar3 = log2((double)(__s->m + 2));
    dVar3 = ceil(dVar3);
    uVar12 = (ulong)dVar3;
    if ((local_800->weights).sparse == true) {
      sparse_parameters::stride_shift(&(local_800->weights).sparse_weights,(uint32_t)uVar12);
      puVar15 = &(local_800->weights).dense_weights._stride_shift;
      if (((local_800->weights).sparse & 1U) != 0) {
        puVar15 = &(local_800->weights).sparse_weights._stride_shift;
      }
      uVar12 = (ulong)*puVar15;
    }
    else {
      (local_800->weights).dense_weights._stride_shift = (uint32_t)uVar12;
    }
    plVar14 = LEARNER::init_learner<OjaNewton,example,LEARNER::learner<char,char>>
                        (&local_7f0,learn,predict,(ulong)(uint)(1 << ((byte)uVar12 & 0x1f)));
    *(code **)(plVar14 + 0x80) = save_load;
    uVar2 = *(undefined8 *)(plVar14 + 0x18);
    *(undefined8 *)(plVar14 + 0x70) = uVar2;
    *(undefined8 *)(plVar14 + 0x78) = *(undefined8 *)(plVar14 + 0x20);
    *(undefined8 *)(plVar14 + 0x58) = uVar2;
    *(code **)(plVar14 + 0x68) = keep_example;
    *(undefined8 *)(plVar14 + 0xb8) = uVar2;
    *(undefined8 *)(plVar14 + 0xc0) = *(undefined8 *)(plVar14 + 0x20);
    *(code **)(plVar14 + 200) = finish;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_5e8.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8.m_name._M_dataplus._M_p != &local_5e8.m_name.field_2) {
    operator_delete(local_5e8.m_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
    operator_delete(local_7c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
    operator_delete(local_7a8._M_dataplus._M_p);
  }
  if (local_7f0._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
      super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl != (OjaNewton *)0x0) {
    (*(code *)local_7f0._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
              super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
              super__Tuple_impl<1UL,_void_(*)(void_*)>.
              super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl)
              (local_7f0._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl);
  }
  return (base_learner *)plVar14;
}

Assistant:

base_learner* OjaNewton_setup(options_i& options, vw& all)
{
  auto ON = scoped_calloc_or_throw<OjaNewton>();

  bool oja_newton;
  float alpha_inverse;

  // These two are the only two boolean options that default to true. For now going to do this hack
  // as the infrastructure doesn't easily support this possibility at the same time providing the
  // ease of bool switches elsewhere. It seems that the switch behavior is more critical because
  // of the positional data argument.
  std::string normalize = "true";
  std::string random_init = "true";
  option_group_definition new_options("OjaNewton options");
  new_options.add(make_option("OjaNewton", oja_newton).keep().help("Online Newton with Oja's Sketch"))
      .add(make_option("sketch_size", ON->m).default_value(10).help("size of sketch"))
      .add(make_option("epoch_size", ON->epoch_size).default_value(1).help("size of epoch"))
      .add(make_option("alpha", ON->alpha).default_value(1.f).help("mutiplicative constant for indentiy"))
      .add(make_option("alpha_inverse", alpha_inverse).help("one over alpha, similar to learning rate"))
      .add(make_option("learning_rate_cnt", ON->learning_rate_cnt)
               .default_value(2.f)
               .help("constant for the learning rate 1/t"))
      .add(make_option("normalize", normalize).help("normalize the features or not"))
      .add(make_option("random_init", random_init).help("randomize initialization of Oja or not"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("OjaNewton"))
    return nullptr;

  ON->all = &all;

  ON->normalize = normalize == "true";
  ON->random_init = random_init == "true";

  if (options.was_supplied("alpha_inverse"))
    ON->alpha = 1.f / alpha_inverse;

  ON->cnt = 0;
  ON->t = 1;
  ON->ev = calloc_or_throw<float>(ON->m + 1);
  ON->b = calloc_or_throw<float>(ON->m + 1);
  ON->D = calloc_or_throw<float>(ON->m + 1);
  ON->A = calloc_or_throw<float*>(ON->m + 1);
  ON->K = calloc_or_throw<float*>(ON->m + 1);
  for (int i = 1; i <= ON->m; i++)
  {
    ON->A[i] = calloc_or_throw<float>(ON->m + 1);
    ON->K[i] = calloc_or_throw<float>(ON->m + 1);
    ON->A[i][i] = 1;
    ON->K[i][i] = 1;
    ON->D[i] = 1;
  }

  ON->buffer = calloc_or_throw<example*>(ON->epoch_size);
  ON->weight_buffer = calloc_or_throw<float>(ON->epoch_size);

  ON->zv = calloc_or_throw<float>(ON->m + 1);
  ON->vv = calloc_or_throw<float>(ON->m + 1);
  ON->tmp = calloc_or_throw<float>(ON->m + 1);

  ON->data.ON = ON.get();
  ON->data.Zx = calloc_or_throw<float>(ON->m + 1);
  ON->data.AZx = calloc_or_throw<float>(ON->m + 1);
  ON->data.delta = calloc_or_throw<float>(ON->m + 1);

  all.weights.stride_shift((uint32_t)ceil(log2(ON->m + 2)));

  learner<OjaNewton, example>& l = init_learner(ON, learn, predict, all.weights.stride());
  l.set_save_load(save_load);
  l.set_finish_example(keep_example);
  l.set_finish(finish);
  return make_base(l);
}